

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

bool __thiscall soul::AST::TernaryOp::isResolved(TernaryOp *this)

{
  int iVar1;
  
  iVar1 = (*(((this->condition).object)->super_Statement).super_ASTObject._vptr_ASTObject[3])();
  if ((char)iVar1 != '\0') {
    iVar1 = (*(((this->trueBranch).object)->super_Statement).super_ASTObject._vptr_ASTObject[3])();
    if ((char)iVar1 != '\0') {
      iVar1 = (*(((this->falseBranch).object)->super_Statement).super_ASTObject._vptr_ASTObject[3])
                        ();
      return SUB41(iVar1,0);
    }
  }
  return false;
}

Assistant:

bool isResolved() const override
        {
            return condition->isResolved()
                    && trueBranch->isResolved()
                    && falseBranch->isResolved();
        }